

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall
QtMWidgets::TableView::insertSection(TableView *this,int index,TableViewSection *section)

{
  AbstractScrollAreaPrivate *pAVar1;
  long lVar2;
  ulong uVar3;
  undefined8 in_R9;
  ulong uVar4;
  
  uVar3 = (ulong)(section == (TableViewSection *)0x0);
  if (index < 0 || section == (TableViewSection *)0x0) {
    return;
  }
  pAVar1 = (this->super_ScrollArea).super_AbstractScrollArea.d.d;
  uVar4 = (ulong)pAVar1[1].topLeftCorner & 0xffffffff;
  if ((long)(ulong)(uint)index <= (long)pAVar1[1].topLeftCorner) {
    uVar4 = (ulong)(uint)index;
  }
  lVar2._0_4_ = pAVar1[1].top;
  lVar2._4_4_ = pAVar1[1].bottom;
  if (*(long *)(*(long *)&section->field_0x8 + 0x10) != lVar2) {
    QWidget::setParent(&section->super_QWidget);
  }
  QBoxLayout::insertWidget
            (*(undefined8 *)((long)&pAVar1[1].indicatorColor.ct + 4),uVar4,section,0,0,in_R9,uVar3);
  QList<QtMWidgets::TableViewSection_*>::insert
            ((QList<QtMWidgets::TableViewSection_*> *)&pAVar1[1].viewport,(long)(int)uVar4,section);
  TableViewSection::setHighlightCellOnClick(section,SUB41(pAVar1[1].right,0));
  QWidget::show();
  return;
}

Assistant:

void
TableView::insertSection( int index, TableViewSection * section )
{
	TableViewPrivate * d = d_func();

	if( !section || index < 0 )
		return;

	if( index > d->sections.size() )
		index = d->sections.size();

	if( section->parent() != d->widget )
		section->setParent( d->widget );
	d->layout->insertWidget( index, section );
	d->sections.insert( index, section );
	section->setHighlightCellOnClick( d->highlightCellOnClick );
	section->show();
}